

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void v_scroll_do_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  float fVar3;
  float ratio_y;
  int val;
  Am_Object local_30;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Object_Method proc;
  Am_Object *cmd_local;
  
  proc.Call = (Am_Object_Method_Type *)cmd;
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_20);
  Am_Object::Get_Object((ushort)&local_30,(ulong)&Am_Scrolling_Group);
  Am_Object::Get_Object((ushort)&local_28,(ulong)&local_30);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_28,0xca);
  Am_Object_Method::operator=((Am_Object_Method *)local_20,pAVar2);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object((Am_Object *)&ratio_y,(Am_Object *)cmd);
  (*(code *)proc.from_wrapper)((Am_Object *)&ratio_y);
  Am_Object::~Am_Object((Am_Object *)&ratio_y);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  fVar3 = get_long_short_ratio_y();
  Am_Object::Set(0x3428,0x65,(ulong)(uint)(int)((float)iVar1 * fVar3));
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, v_scroll_do, (Am_Object cmd))
{
  //first, call the standard method
  Am_Object_Method proc;
  proc = Am_Scrolling_Group.Get_Object(Am_V_SCROLLER)
             .Get_Object(Am_COMMAND)
             .Get(Am_DO_METHOD);
  proc.Call(cmd);
  //update the long range scroller
  int val = cmd.Get(Am_VALUE);
  float ratio_y = get_long_short_ratio_y();
  SP_Long_Feed.Set(Am_TOP, (int)(val * ratio_y));
}